

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O1

string * __thiscall
despot::ChainState::text_abi_cxx11_(string *__return_storage_ptr__,ChainState *this)

{
  pointer pvVar1;
  long lVar2;
  char cVar3;
  long *plVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ostringstream oss;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  plVar4 = (long *)std::ostream::operator<<((ostream *)local_1a8,this->mdp_state);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if ((this->mdp_transitions_).
      super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->mdp_transitions_).
      super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      pvVar1 = (this->mdp_transitions_).
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar1[uVar7].
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data + 8) !=
          pvVar1[uVar7].
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar6 = 0;
        do {
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)uVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(int)uVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ->",3);
          lVar2 = *(long *)&(this->mdp_transitions_).
                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar7].
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          if (*(long *)(lVar2 + 8 + uVar6 * 0x18) != *(long *)(lVar2 + uVar6 * 0x18)) {
            uVar8 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
              std::ostream::_M_insert<double>
                        (*(double *)
                          (*(long *)(*(long *)&(this->mdp_transitions_).
                                               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                               ._M_impl.super__Vector_impl_data + uVar6 * 0x18) +
                          uVar8 * 8));
              uVar8 = uVar8 + 1;
              lVar2 = *(long *)&(this->mdp_transitions_).
                                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data;
            } while (uVar8 < (ulong)(*(long *)(lVar2 + 8 + uVar6 * 0x18) -
                                     *(long *)(lVar2 + uVar6 * 0x18) >> 3));
          }
          cVar3 = (char)(ostringstream *)local_1a8;
          std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
          std::ostream::put(cVar3);
          std::ostream::flush();
          pvVar1 = (this->mdp_transitions_).
                   super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = uVar6 + 1;
          uVar8 = ((long)*(pointer *)
                          ((long)&pvVar1[uVar7].
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data + 8) -
                   *(long *)&pvVar1[uVar7].
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data >> 3) * -0x5555555555555555;
        } while (uVar6 <= uVar8 && uVar8 - uVar6 != 0);
      }
      uVar7 = uVar7 + 1;
      uVar6 = ((long)(this->mdp_transitions_).
                     super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->mdp_transitions_).
                     super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string ChainState::text() const {
	ostringstream oss;
	oss << mdp_state << endl;
	for (int s1 = 0; s1 < mdp_transitions_.size(); s1++) {
		for (int a = 0; a < mdp_transitions_[s1].size(); a++) {
			oss << s1 << " " << a << " ->";
			for (int s2 = 0; s2 < mdp_transitions_[s1][a].size(); s2++)
				oss << " " << mdp_transitions_[s1][a][s2];
			oss << endl;
		}
	}
	return oss.str();
}